

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall
IRT::PrintVisitor::Visit(PrintVisitor *this,JumpConditionalStatement *jump_conditional_statement)

{
  ofstream *poVar1;
  ostream *poVar2;
  LogicOperatorType type;
  string local_50;
  
  PrintTabs(this);
  poVar1 = &this->stream_;
  poVar2 = std::operator<<((ostream *)poVar1,"JumpConditionalStatement: ");
  ToString_abi_cxx11_(&local_50,
                      (IRT *)(ulong)(uint)(int)(char)jump_conditional_statement->operator_type_,type
                     );
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_50);
  PrintTabs(this);
  poVar2 = std::operator<<((ostream *)poVar1,"TrueLabel: ");
  Label::ToString_abi_cxx11_(&local_50,&jump_conditional_statement->label_true_);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_50);
  PrintTabs(this);
  poVar2 = std::operator<<((ostream *)poVar1,"FalseLabel: ");
  Label::ToString_abi_cxx11_(&local_50,&jump_conditional_statement->label_false_);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_50);
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(jump_conditional_statement->left_operand_->super_BaseElement)._vptr_BaseElement[2])
            (jump_conditional_statement->left_operand_,this);
  (*(jump_conditional_statement->right_operand_->super_BaseElement)._vptr_BaseElement[2])
            (jump_conditional_statement->right_operand_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(JumpConditionalStatement *jump_conditional_statement) {
  PrintTabs();
  stream_ << "JumpConditionalStatement: " <<
    ToString(jump_conditional_statement->operator_type_)<< std::endl;
  PrintTabs();
  stream_ << "TrueLabel: " << jump_conditional_statement->label_true_.ToString() << std::endl;
  PrintTabs();
  stream_ << "FalseLabel: " << jump_conditional_statement->label_false_.ToString() << std::endl;
  ++num_tabs_;
  jump_conditional_statement->left_operand_->Accept(this);
  jump_conditional_statement->right_operand_->Accept(this);
  --num_tabs_;
}